

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O2

SampledSpectrum __thiscall
pbrt::DiffuseAreaLight::L
          (DiffuseAreaLight *this,Point3f *p,Normal3f *n,Point2f *uv,Vector3f *w,
          SampledWavelengths *lambda)

{
  RGB *pRVar1;
  int c;
  int c_00;
  RGBSpectrum *this_00;
  type tVar2;
  Float FVar3;
  undefined1 auVar4 [12];
  undefined1 auVar8 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar11 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  SampledSpectrum SVar12;
  RGB local_b8;
  Tuple2<pbrt::Point2,_float> local_a8;
  undefined8 uStack_a0;
  DiffuseAreaLight *local_90;
  SampledWavelengths *local_88;
  WrapMode2D local_80;
  undefined1 local_78 [16];
  SampledSpectrum local_68;
  RGBSpectrum local_58;
  undefined1 auVar5 [16];
  
  if (this->twoSided == false) {
    tVar2 = Dot<float>(n,w);
    in_ZMM1 = ZEXT1664(ZEXT816(0) << 0x40);
    if (tVar2 < 0.0) {
      SampledSpectrum::SampledSpectrum(&local_68,0.0);
      return (array<float,_4>)local_68.values.values;
    }
  }
  auVar11 = in_ZMM1._8_56_;
  if (((this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x < 1) ||
     ((this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y < 1)) {
    auVar8 = (undefined1  [56])0x0;
    local_a8.x = this->scale;
    SVar12 = DenselySampledSpectrum::Sample(&this->Lemit,lambda);
    auVar9._0_8_ = SVar12.values.values._8_8_;
    auVar9._8_56_ = auVar11;
    auVar6._0_8_ = SVar12.values.values._0_8_;
    auVar6._8_56_ = auVar8;
    auVar5 = vmovlhps_avx(auVar6._0_16_,auVar9._0_16_);
    this_00 = &local_58;
  }
  else {
    local_b8.r = 0.0;
    local_b8.g = 0.0;
    local_b8.b = 0.0;
    local_90 = this;
    local_88 = lambda;
    for (c_00 = 0; auVar11 = in_ZMM1._8_56_, c_00 != 3; c_00 = c_00 + 1) {
      local_a8 = uv->super_Tuple2<pbrt::Point2,_float>;
      uStack_a0 = 0;
      WrapMode2D::WrapMode2D(&local_80,Clamp);
      FVar3 = Image::BilerpChannel(&this->image,(Point2f)local_a8,c_00,local_80);
      pRVar1 = &local_b8;
      if ((c_00 != 0) && (pRVar1 = (RGB *)&local_b8.g, c_00 != 1)) {
        pRVar1 = (RGB *)&local_b8.b;
      }
      pRVar1->r = FVar3;
    }
    auVar8 = (undefined1  [56])0x0;
    local_a8.x = local_90->scale;
    RGBSpectrum::RGBSpectrum(&local_58,local_90->imageColorSpace,&local_b8);
    SVar12 = RGBSpectrum::Sample(&local_58,local_88);
    auVar10._0_8_ = SVar12.values.values._8_8_;
    auVar10._8_56_ = auVar11;
    auVar7._0_8_ = SVar12.values.values._0_8_;
    auVar7._8_56_ = auVar8;
    auVar5 = vmovlhps_avx(auVar7._0_16_,auVar10._0_16_);
    this_00 = (RGBSpectrum *)local_78;
  }
  auVar4 = auVar5._0_12_;
  (this_00->rgb).r = (Float)auVar4._0_4_;
  (this_00->rgb).g = (Float)auVar4._4_4_;
  (this_00->rgb).b = (Float)auVar4._8_4_;
  this_00->scale = (Float)auVar5._12_4_;
  SVar12 = SampledSpectrum::operator*((SampledSpectrum *)this_00,local_a8.x);
  return (array<float,_4>)(array<float,_4>)SVar12;
}

Assistant:

L(const Point3f &p, const Normal3f &n, const Point2f &uv,
                      const Vector3f &w, const SampledWavelengths &lambda) const {
        if (!twoSided && Dot(n, w) < 0)
            return SampledSpectrum(0.f);

        if (image) {
            RGB rgb;
            for (int c = 0; c < 3; ++c)
                rgb[c] = image.BilerpChannel(uv, c);
            return scale * RGBSpectrum(*imageColorSpace, rgb).Sample(lambda);
        } else
            return scale * Lemit.Sample(lambda);
    }